

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

unsigned_long
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<int,unsigned_long>
          (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  duckdb *this;
  string local_40;
  
  this = (duckdb *)(ulong)(uint)input;
  if (input < 0) {
    CastExceptionText<int,unsigned_long>(&local_40,this,(int)idx);
    this = (duckdb *)
           HandleVectorCastError::Operation<unsigned_long>
                     (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return (unsigned_long)this;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}